

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  Enum EVar4;
  char *format;
  uint16_t layer;
  uint16_t version;
  uint32_t magic;
  BinaryReader reader;
  uint16_t local_13a;
  uint16_t local_138;
  ReadSectionsOptions local_135;
  uint local_134;
  BinaryReader local_130;
  
  local_130.state_.offset = 0;
  local_130.read_end_ = size;
  local_130.state_.data = (uint8_t *)data;
  local_130.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging
            (&local_130.logging_delegate_,options->log_stream,delegate);
  local_130.delegate_ = &local_130.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    local_130.delegate_ = delegate;
  }
  local_130.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.last_known_section_ = Invalid;
  local_130.did_read_names_section_ = false;
  local_130.reading_custom_section_ = false;
  local_130.num_func_imports_ = 0;
  local_130.num_table_imports_ = 0;
  local_130.num_memory_imports_ = 0;
  local_130.num_global_imports_ = 0;
  local_130.num_tag_imports_ = 0;
  local_130.num_function_signatures_ = 0;
  local_130.num_function_bodies_ = 0;
  local_130.num_data_segments_ = 0;
  local_130.data_count_ = 0xffffffff;
  local_130.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&local_130.state_);
  bVar1 = options->stop_on_first_error;
  local_134 = 0;
  RVar2 = anon_unknown_26::BinaryReader::ReadT<unsigned_int>
                    (&local_130,&local_134,"uint32_t","magic");
  EVar4 = Error;
  if (RVar2.enum_ == Error) goto LAB_00123bbd;
  if (local_134 == 0x6d736100) {
    local_138 = 0;
    local_13a = 0;
    RVar2 = anon_unknown_26::BinaryReader::ReadU16(&local_130,&local_138,"version");
    EVar4 = Error;
    if (RVar2.enum_ == Error) goto LAB_00123bbd;
    RVar2 = anon_unknown_26::BinaryReader::ReadU16(&local_130,&local_13a,"layer");
    if (RVar2.enum_ == Error) goto LAB_00123bbd;
    if (local_13a == 1) {
      format = "wasm components are not yet supported in this tool";
    }
    else {
      if (local_13a != 0) {
        anon_unknown_26::BinaryReader::PrintError(&local_130,"unsupported wasm layer: %#x");
        goto LAB_00123bbd;
      }
      if (local_138 != 1) {
        EVar4 = Error;
        anon_unknown_26::BinaryReader::PrintError
                  (&local_130,"bad wasm file version: %#x (expected %#x)",(ulong)local_138,1);
        goto LAB_00123bbd;
      }
      EVar4 = Error;
      iVar3 = (*(local_130.delegate_)->_vptr_BinaryReaderDelegate[4])(local_130.delegate_,1);
      if (iVar3 == 0) {
        local_135.stop_on_first_error = bVar1;
        RVar2 = anon_unknown_26::BinaryReader::ReadSections(&local_130,&local_135);
        if (RVar2.enum_ == Error) goto LAB_00123bbd;
        if (local_130.num_function_signatures_ == local_130.num_function_bodies_) {
          if ((local_130.num_data_segments_ == 0) && (1 < local_130.data_count_ + 1)) {
            format = "Data section missing but DataCount non-zero";
          }
          else {
            iVar3 = (*(local_130.delegate_)->_vptr_BinaryReaderDelegate[5])();
            if (iVar3 == 0) {
              EVar4 = Ok;
              goto LAB_00123bbd;
            }
            format = "EndModule callback failed";
          }
        }
        else {
          format = "function signature count != function body count";
        }
      }
      else {
        format = "BeginModule callback failed";
      }
    }
  }
  else {
    format = "bad magic value";
  }
  EVar4 = Error;
  anon_unknown_26::BinaryReader::PrintError(&local_130,format);
LAB_00123bbd:
  if (local_130.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.catches_.
                    super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.catches_.
                          super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.catches_.
                          super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.target_depths_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.target_depths_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.target_depths_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.fields_.
                    super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.fields_.
                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.fields_.
                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.result_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.result_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.result_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.param_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.param_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.param_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (Result)EVar4;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule(
      BinaryReader::ReadModuleOptions{options.stop_on_first_error});
}